

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_upgrade2
              (nghttp2_session *session,uint8_t *settings_payload,size_t settings_payloadlen,
              int head_request,void *stream_user_data)

{
  byte *pbVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  
  iVar2 = nghttp2_session_upgrade_internal
                    (session,settings_payload,settings_payloadlen,stream_user_data);
  if (iVar2 == 0) {
    pnVar3 = nghttp2_session_get_stream(session,1);
    if (pnVar3 == (nghttp2_stream *)0x0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x1fd5,
                    "int nghttp2_session_upgrade2(nghttp2_session *, const uint8_t *, size_t, int, void *)"
                   );
    }
    if (head_request != 0) {
      pbVar1 = (byte *)((long)&pnVar3->http_flags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_upgrade2(nghttp2_session *session,
                             const uint8_t *settings_payload,
                             size_t settings_payloadlen, int head_request,
                             void *stream_user_data) {
  int rv;
  nghttp2_stream *stream;

  rv = nghttp2_session_upgrade_internal(session, settings_payload,
                                        settings_payloadlen, stream_user_data);
  if (rv != 0) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, 1);
  assert(stream);

  if (head_request) {
    stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_HEAD;
  }

  return 0;
}